

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::ImmedSrcToReg(Instr *instr,Opnd *newOpnd,int srcNum)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int srcNum_local;
  Opnd *newOpnd_local;
  Instr *instr_local;
  
  if (srcNum == 2) {
    IR::Instr::SetSrc2(instr,newOpnd);
  }
  else {
    if (srcNum != 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1d53,"(srcNum == 1)","srcNum == 1");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    IR::Instr::SetSrc1(instr,newOpnd);
  }
  return;
}

Assistant:

void
LowererMD::ImmedSrcToReg(IR::Instr * instr, IR::Opnd * newOpnd, int srcNum)
{
    if (srcNum == 2)
    {
        instr->SetSrc2(newOpnd);
    }
    else
    {
        Assert(srcNum == 1);
        instr->SetSrc1(newOpnd);
    }
}